

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
::destroy(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
          *this)

{
  bool bVar1;
  allocator_type *alloc;
  slot_type *slot;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    alloc = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
            ::alloc(this);
    slot = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
           ::slot(this);
    hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
    destroy<std::allocator<int>>(alloc,slot);
    reset(this);
  }
  return;
}

Assistant:

void destroy() {
        if (!empty()) {
            PolicyTraits::destroy(alloc(), slot());
            reset();
        }
    }